

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void output_bitmap(gen_ctx_t gen_ctx,char *head,bitmap_t bm,int print_name_p,MIR_reg_t *reg_map)

{
  MIR_context_t ctx;
  ulong uVar1;
  FILE *__stream;
  bool bVar2;
  uint uVar3;
  MIR_type_t tp;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong local_58;
  
  if ((bm != (bitmap_t)0x0) && (bm->els_num != 0)) {
    ctx = gen_ctx->ctx;
    sVar7 = 0;
    do {
      if (bm->varr[sVar7] != 0) {
        fputs(head,(FILE *)gen_ctx->debug_file);
        uVar10 = 0;
        while( true ) {
          uVar6 = uVar10 >> 6;
          uVar1 = bm->els_num;
          bVar2 = true;
          uVar8 = uVar10;
          if (uVar6 < uVar1) break;
LAB_00167020:
          if (bVar2) {
            fputc(10,(FILE *)gen_ctx->debug_file);
            return;
          }
          fprintf((FILE *)gen_ctx->debug_file," %3lu",local_58);
          uVar10 = uVar8;
          if ((print_name_p != 0) && (reg_map != (MIR_reg_t *)0x0 || 0x21 < local_58)) {
            if (reg_map == (MIR_reg_t *)0x0) {
              uVar3 = (uint)local_58;
            }
            else {
              uVar3 = reg_map[local_58];
            }
            if (uVar3 < 0x21) {
              __assert_fail("reg >= ST1_HARD_REG",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x535,
                            "void output_bitmap(gen_ctx_t, const char *, bitmap_t, int, MIR_reg_t *)"
                           );
            }
            __stream = (FILE *)gen_ctx->debug_file;
            tp = MIR_reg_type(ctx,uVar3 - 0x21,(gen_ctx->curr_func_item->u).func);
            pcVar4 = MIR_type_str(ctx,tp);
            pcVar5 = MIR_reg_name(ctx,uVar3 - 0x21,(gen_ctx->curr_func_item->u).func);
            fprintf(__stream,"(%s:%s)",pcVar4,pcVar5);
          }
        }
        uVar8 = uVar1 << 6;
LAB_00166fd7:
        if ((bm->varr[uVar6] == 0) || (uVar9 = bm->varr[uVar6] >> (uVar10 & 0x3f), uVar9 == 0))
        goto LAB_00166fea;
        uVar1 = uVar9 & 1;
        local_58 = uVar10;
        while (uVar1 == 0) {
          local_58 = local_58 + 1;
          uVar1 = uVar9 & 2;
          uVar9 = uVar9 >> 1;
        }
        uVar8 = local_58 + 1;
        bVar2 = false;
        goto LAB_00167020;
      }
      sVar7 = sVar7 + 1;
    } while (bm->els_num != sVar7);
  }
  return;
LAB_00166fea:
  uVar6 = uVar6 + 1;
  uVar10 = uVar6 * 0x40;
  if (uVar1 == uVar6) goto LAB_00167020;
  goto LAB_00166fd7;
}

Assistant:

static void output_bitmap (gen_ctx_t gen_ctx, const char *head, bitmap_t bm, int print_name_p,
                           MIR_reg_t *reg_map) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_reg_t reg;
  size_t nel;
  bitmap_iterator_t bi;

  if (bm == NULL || bitmap_empty_p (bm)) return;
  fprintf (debug_file, "%s", head);
  FOREACH_BITMAP_BIT (bi, bm, nel) {
    fprintf (debug_file, " %3lu", (unsigned long) nel);
    if (print_name_p && (reg_map != NULL || nel > MAX_HARD_REG)) {
      reg = (MIR_reg_t) nel;
      if (reg_map != NULL) reg = reg_map[nel];
      gen_assert (reg >= MAX_HARD_REG);
      fprintf (debug_file, "(%s:%s)",
               MIR_type_str (ctx, MIR_reg_type (ctx, reg - MAX_HARD_REG, curr_func_item->u.func)),
               MIR_reg_name (ctx, reg - MAX_HARD_REG, curr_func_item->u.func));
    }
  }
  fprintf (debug_file, "\n");
}